

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int write_to_temp(archive_write *a,void *buff,size_t s)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  char *fmt;
  
  piVar3 = (int *)a->format_data;
  if (*piVar3 == -1) {
    piVar3[2] = 0;
    piVar3[3] = 0;
    iVar1 = __archive_mktemp((char *)0x0);
    *piVar3 = iVar1;
    if (iVar1 < 0) {
      fmt = "Couldn\'t create temporary file";
LAB_0043f391:
      piVar3 = __errno_location();
      archive_set_error(&a->archive,*piVar3,fmt);
      return -0x1e;
    }
  }
  if (s != 0) {
    fmt = "fwrite function failed";
    do {
      sVar2 = write(*piVar3,buff,s);
      if (sVar2 < 0) goto LAB_0043f391;
      buff = (void *)((long)buff + sVar2);
      *(long *)(piVar3 + 2) = *(long *)(piVar3 + 2) + sVar2;
      s = s - sVar2;
    } while (s != 0);
  }
  return 0;
}

Assistant:

static int
write_to_temp(struct archive_write *a, const void *buff, size_t s)
{
	struct iso9660 *iso9660 = a->format_data;
	ssize_t written;
	const unsigned char *b;

	b = (const unsigned char *)buff;
	while (s) {
		written = write(iso9660->temp_fd, b, s);
		if (written < 0) {
			archive_set_error(&a->archive, errno,
			    "Can't write to temporary file");
			return (ARCHIVE_FATAL);
		}
		s -= written;
		b += written;
	}
	return (ARCHIVE_OK);
}